

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_sse2.h
# Opt level: O2

__m128i convolve(__m128i *s,__m128i *coeffs)

{
  longlong in_RAX;
  longlong in_RDX;
  __m128i alVar1;
  
  pmaddwd((undefined1  [16])*s,(undefined1  [16])*coeffs);
  pmaddwd((undefined1  [16])s[1],(undefined1  [16])coeffs[1]);
  pmaddwd((undefined1  [16])s[2],(undefined1  [16])coeffs[2]);
  pmaddwd((undefined1  [16])s[3],(undefined1  [16])coeffs[3]);
  alVar1[1] = in_RDX;
  alVar1[0] = in_RAX;
  return alVar1;
}

Assistant:

static inline __m128i convolve(const __m128i *const s,
                               const __m128i *const coeffs) {
  const __m128i res_0 = _mm_madd_epi16(s[0], coeffs[0]);
  const __m128i res_1 = _mm_madd_epi16(s[1], coeffs[1]);
  const __m128i res_2 = _mm_madd_epi16(s[2], coeffs[2]);
  const __m128i res_3 = _mm_madd_epi16(s[3], coeffs[3]);

  const __m128i res =
      _mm_add_epi32(_mm_add_epi32(res_0, res_1), _mm_add_epi32(res_2, res_3));

  return res;
}